

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O2

void __thiscall DropdownMenu::DropdownMenu(DropdownMenu *this)

{
  Vector2f local_20;
  
  UIComponent::UIComponent(&this->super_UIComponent);
  (this->super_UIComponent).super_Drawable._vptr_Drawable =
       (_func_int **)&PTR__DropdownMenu_001c51a8;
  (this->super_UIComponent).super_Transformable._vptr_Transformable =
       (_func_int **)&PTR__DropdownMenu_001c51e0;
  TextButton::TextButton(&this->button);
  local_20.x = 0.0;
  local_20.y = 0.0;
  sf::RectangleShape::RectangleShape(&this->background,&local_20);
  (this->menuButtons).super__Vector_base<TextButton,_std::allocator<TextButton>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->menuButtons).super__Vector_base<TextButton,_std::allocator<TextButton>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->menuButtons).super__Vector_base<TextButton,_std::allocator<TextButton>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

DropdownMenu::DropdownMenu() {}